

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O1

size_t prt_light(wchar_t row,wchar_t col)

{
  loc grid;
  wchar_t wVar1;
  wchar_t wVar2;
  char *str;
  
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  wVar1 = square_light(cave,grid);
  str = format("Light %d ",(ulong)(uint)wVar1);
  c_put_str((wVar1 < L'\x01') * '\x05' + '\v',str,row,col);
  wVar2 = -wVar1;
  if (L'\0' < wVar1) {
    wVar2 = wVar1;
  }
  return (ulong)(uint)((1 - (wVar1 >> 0x1f)) - (uint)((uint)wVar2 < 10) | 8);
}

Assistant:

static size_t prt_light(int row, int col)
{
	int light = square_light(cave, player->grid);

	if (light > 0) {
		c_put_str(COLOUR_YELLOW, format("Light %d ", light), row, col);
	} else {
		c_put_str(COLOUR_PURPLE, format("Light %d ", light), row, col);
	}

	return 8 + (ABS(light) > 9 ? 1 : 0) + (light < 0 ? 1 : 0);
}